

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_swap_props(Tree *this,size_t n_,size_t m_)

{
  NodeType_e NVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  NodeData *pNVar13;
  NodeData *pNVar14;
  NodeScalar __tmp;
  
  pNVar13 = _p(this,n_);
  pNVar14 = _p(this,m_);
  NVar1 = (pNVar13->m_type).type;
  (pNVar13->m_type).type = (pNVar14->m_type).type;
  (pNVar14->m_type).type = NVar1;
  pcVar2 = (pNVar13->m_key).tag.str;
  sVar3 = (pNVar13->m_key).tag.len;
  pcVar4 = (pNVar13->m_key).scalar.str;
  sVar5 = (pNVar13->m_key).scalar.len;
  pcVar6 = (pNVar13->m_key).anchor.str;
  sVar7 = (pNVar13->m_key).anchor.len;
  pcVar8 = (pNVar14->m_key).tag.str;
  sVar9 = (pNVar14->m_key).tag.len;
  pcVar10 = (pNVar14->m_key).scalar.str;
  sVar11 = (pNVar14->m_key).scalar.len;
  sVar12 = (pNVar14->m_key).anchor.len;
  (pNVar13->m_key).anchor.str = (pNVar14->m_key).anchor.str;
  (pNVar13->m_key).anchor.len = sVar12;
  (pNVar13->m_key).scalar.str = pcVar10;
  (pNVar13->m_key).scalar.len = sVar11;
  (pNVar13->m_key).tag.str = pcVar8;
  (pNVar13->m_key).tag.len = sVar9;
  (pNVar14->m_key).anchor.str = pcVar6;
  (pNVar14->m_key).anchor.len = sVar7;
  (pNVar14->m_key).scalar.str = pcVar4;
  (pNVar14->m_key).scalar.len = sVar5;
  (pNVar14->m_key).tag.str = pcVar2;
  (pNVar14->m_key).tag.len = sVar3;
  pcVar2 = (pNVar13->m_val).tag.str;
  sVar3 = (pNVar13->m_val).tag.len;
  pcVar4 = (pNVar13->m_val).scalar.str;
  sVar5 = (pNVar13->m_val).scalar.len;
  pcVar6 = (pNVar13->m_val).anchor.str;
  sVar7 = (pNVar13->m_val).anchor.len;
  pcVar8 = (pNVar14->m_val).tag.str;
  sVar9 = (pNVar14->m_val).tag.len;
  pcVar10 = (pNVar14->m_val).scalar.str;
  sVar11 = (pNVar14->m_val).scalar.len;
  sVar12 = (pNVar14->m_val).anchor.len;
  (pNVar13->m_val).anchor.str = (pNVar14->m_val).anchor.str;
  (pNVar13->m_val).anchor.len = sVar12;
  (pNVar13->m_val).scalar.str = pcVar10;
  (pNVar13->m_val).scalar.len = sVar11;
  (pNVar13->m_val).tag.str = pcVar8;
  (pNVar13->m_val).tag.len = sVar9;
  (pNVar14->m_val).anchor.str = pcVar6;
  (pNVar14->m_val).anchor.len = sVar7;
  (pNVar14->m_val).scalar.str = pcVar4;
  (pNVar14->m_val).scalar.len = sVar5;
  (pNVar14->m_val).tag.str = pcVar2;
  (pNVar14->m_val).tag.len = sVar3;
  return;
}

Assistant:

void Tree::_swap_props(size_t n_, size_t m_)
{
    NodeData &C4_RESTRICT n = *_p(n_);
    NodeData &C4_RESTRICT m = *_p(m_);
    std::swap(n.m_type, m.m_type);
    std::swap(n.m_key, m.m_key);
    std::swap(n.m_val, m.m_val);
}